

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O1

void conn_port_to_str(uint16_t port,char *result)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ushort uVar5;
  uint16_t port_tmp;
  ulong uVar6;
  
  uVar6 = (ulong)port;
  cVar1 = -1;
  uVar3 = (uint)port;
  uVar4 = uVar6;
  do {
    cVar1 = cVar1 + '\x01';
    uVar5 = (ushort)uVar4;
    uVar4 = (ulong)((uint)uVar4 / 10);
  } while (9 < uVar5);
  switch(cVar1) {
  case '\x04':
    uVar2 = (port >> 4) / 0x271;
    *result = (char)uVar2 + '0';
    uVar6 = (ulong)(uVar3 + uVar2 * -10000);
    result = result + 1;
  case '\x03':
    uVar3 = (uint)((uVar6 & 0xffff) >> 3) / 0x7d;
    *result = (char)uVar3 + '0';
    uVar6 = (ulong)((int)uVar6 + uVar3 * -1000);
    result = result + 1;
  case '\x02':
    uVar3 = (uint)((uVar6 & 0xffff) >> 2) / 0x19;
    *result = (char)uVar3 + '0';
    uVar3 = (int)uVar6 + uVar3 * -100;
    result = result + 1;
  case '\x01':
    uVar2 = (uVar3 & 0xffff) / 10;
    *result = (char)uVar2 + '0';
    uVar6 = (ulong)(uVar3 + uVar2 * -10);
    result = result + 1;
  case '\0':
    *result = (char)uVar6 + '0';
    result = result + 1;
  default:
    *result = '\0';
    return;
  }
}

Assistant:

void conn_port_to_str(uint16_t port, char result[6])
{
	uint16_t port_tmp = port;
	uint8_t n = 0;

	do {
		n++;
		port_tmp /= 10;
	} while (port_tmp != 0);

	port_tmp = port;

	switch (n) {
	case 5:
		*result = (char)(48 + port_tmp / 10000);
		port_tmp %= 10000;
		result++;
		/* fall through */
	case 4:
		*result = (char)(48 + port_tmp / 1000);
		port_tmp %= 1000;
		result++;
		/* fall through */
	case 3:
		*result = (char)(48 + port_tmp / 100);
		port_tmp %= 100;
		result++;
		/* fall through */
	case 2:
		*result = (char)(48 + port_tmp / 10);
		port_tmp %= 10;
		result++;
		/* fall through */
	case 1:
		*result = (char)(48 + port_tmp);
		result++;
	}

	*result = '\0';
}